

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall
CLI::ExcludesError::ExcludesError(ExcludesError *this,string *curname,string *subname)

{
  pointer pcVar1;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  pcVar1 = (curname->_M_dataplus)._M_p;
  local_60[0] = local_50;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + curname->_M_string_length);
  ::std::__cxx11::string::append((char *)local_60);
  plVar2 = (long *)::std::__cxx11::string::_M_append
                             ((char *)local_60,(ulong)(subname->_M_dataplus)._M_p);
  psVar3 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3) {
    local_40.field_2._M_allocated_capacity = *psVar3;
    local_40.field_2._8_8_ = plVar2[3];
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  }
  else {
    local_40.field_2._M_allocated_capacity = *psVar3;
    local_40._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_40._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  ExcludesError(this,&local_40,ExcludesError);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}